

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_stop_seq(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDI;
  char msg [49];
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_58 [64];
  undefined8 local_18;
  undefined8 local_10;
  NodeData *local_8;
  
  local_10 = *(undefined8 *)(in_RDI + 0x30);
  local_18 = *(undefined8 *)(*(long *)(in_RDI + 0x9f0) + 0x10);
  local_8 = Tree::_p((Tree *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (((local_8->m_type).type & SEQ) == NOTYPE) {
    memcpy(local_58,"check failed: (m_tree->is_seq(m_state->node_id))",0x31);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    (*pcVar1)(local_58,0x31,*(undefined8 *)(in_RDI + 0x9d0));
  }
  return;
}

Assistant:

void Parser::_stop_seq()
{
    _c4dbgp("stop_seq");
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
}